

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O3

UChar * icu_63::copySpec(UChar *spec)

{
  short *psVar1;
  void *__dest;
  UChar *pUVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    psVar1 = (short *)((long)spec + uVar3);
    uVar3 = uVar3 + 2;
  } while (*psVar1 != -1);
  __dest = uprv_malloc_63(uVar3 & 0xffffffff);
  if (__dest != (void *)0x0) {
    pUVar2 = (UChar *)memcpy(__dest,spec,uVar3 & 0xffffffff);
    return pUVar2;
  }
  return (UChar *)0x0;
}

Assistant:

static UChar* copySpec(const UChar* spec) {
    int32_t len = 0;
    while (spec[len] != END) {
        ++len;
    }
    ++len;
    UChar *result = (UChar *)uprv_malloc(len*sizeof(UChar));
    // Check for memory allocation error. 
    if (result != NULL) {
    	uprv_memcpy(result, spec, (size_t)len*sizeof(result[0]));
    }
    return result;
}